

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O3

void ggml_print_objects(ggml_context *ctx)

{
  ggml_object *pgVar1;
  
  pgVar1 = ctx->objects_begin;
  ggml_log_internal(GGML_LOG_LEVEL_INFO,"%s: objects in context %p:\n","ggml_print_objects",ctx);
  for (; pgVar1 != (ggml_object *)0x0; pgVar1 = pgVar1->next) {
    ggml_log_internal(GGML_LOG_LEVEL_INFO,
                      " - ggml_object: type = %d, offset = %zu, size = %zu, next = %p\n",
                      (ulong)pgVar1->type,pgVar1->offs,pgVar1->size,pgVar1->next);
  }
  ggml_log_internal(GGML_LOG_LEVEL_INFO,"%s: --- end ---\n","ggml_print_objects");
  return;
}

Assistant:

void ggml_print_objects(const struct ggml_context * ctx) {
    struct ggml_object * obj = ctx->objects_begin;

    GGML_LOG_INFO("%s: objects in context %p:\n", __func__, (const void *) ctx);

    while (obj != NULL) {
        ggml_print_object(obj);
        obj = obj->next;
    }

    GGML_LOG_INFO("%s: --- end ---\n", __func__);
}